

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

size_t __thiscall AutoFile::detail_fread(AutoFile *this,Span<std::byte> dst)

{
  long lVar1;
  FILE *__stream;
  pointer pbVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  byte *__ptr;
  ulong uVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  
  __ptr = dst.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = (FILE *)this->m_file;
  if (__stream == (FILE *)0x0) {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar5,(error_code *)"AutoFile::read: file handle is nullptr");
  }
  else {
    if ((this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        sVar4 = fread(__ptr,1,dst.m_size,__stream);
        return sVar4;
      }
      goto LAB_00779cfa;
    }
    uVar3 = ftell(__stream);
    if (-1 < (long)uVar3) {
      sVar4 = fread(__ptr,1,dst.m_size,(FILE *)this->m_file);
      pbVar2 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pbVar2;
      if (sVar4 != 0 && uVar6 != 0) {
        sVar7 = 0;
        uVar3 = uVar3 % uVar6;
        do {
          __ptr[sVar7] = __ptr[sVar7] ^ pbVar2[uVar3];
          uVar3 = uVar3 + 1;
          if (uVar3 == uVar6) {
            uVar3 = 0;
          }
          sVar7 = sVar7 + 1;
        } while (sVar4 != sVar7);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return sVar4;
      }
      goto LAB_00779cfa;
    }
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)"AutoFile::read: ftell failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_00779cfa:
  __stack_chk_fail();
}

Assistant:

std::size_t AutoFile::detail_fread(Span<std::byte> dst)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::read: file handle is nullptr");
    if (m_xor.empty()) {
        return std::fread(dst.data(), 1, dst.size(), m_file);
    } else {
        const auto init_pos{std::ftell(m_file)};
        if (init_pos < 0) throw std::ios_base::failure("AutoFile::read: ftell failed");
        std::size_t ret{std::fread(dst.data(), 1, dst.size(), m_file)};
        util::Xor(dst.subspan(0, ret), m_xor, init_pos);
        return ret;
    }
}